

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O3

int32_t parse_justice_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int32_t iVar1;
  int64_t *piVar2;
  uint32_t nargs;
  uint local_1c;
  
  iVar1 = parse_pos_number_bfr(bfr,&local_1c);
  if (iVar1 != 0) {
    piVar2 = (int64_t *)btor2parser_realloc(l->args,(ulong)local_1c << 3);
    l->args = piVar2;
    l->nargs = local_1c;
    iVar1 = parse_args(bfr,l,local_1c);
    return iVar1;
  }
  return 0;
}

Assistant:

static int32_t
parse_justice_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  uint32_t nargs;
  if (!parse_pos_number_bfr (bfr, &nargs)) return 0;
  l->args  = btor2parser_realloc (l->args, sizeof (int64_t) * nargs);
  l->nargs = nargs;
  if (!parse_args (bfr, l, nargs)) return 0;
  return 1;
}